

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImBoolVector::Resize(ImBoolVector *this,int sz)

{
  int iVar1;
  void *__dest;
  int iVar2;
  int iVar3;
  
  iVar2 = sz + 0x1f >> 5;
  iVar1 = *(int *)(this + 4);
  if (iVar1 < iVar2) {
    if (iVar1 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar1 / 2 + iVar1;
    }
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
    if (iVar1 < iVar3) {
      __dest = ImGui::MemAlloc((long)iVar3 << 2);
      if (*(void **)(this + 8) != (void *)0x0) {
        memcpy(__dest,*(void **)(this + 8),(long)*(int *)this << 2);
        ImGui::MemFree(*(void **)(this + 8));
      }
      *(void **)(this + 8) = __dest;
      *(int *)(this + 4) = iVar3;
    }
  }
  *(int *)this = iVar2;
  memset(*(void **)(this + 8),0,(long)iVar2 << 2);
  return;
}

Assistant:

void            Resize(int sz)          { Storage.resize((sz + 31) >> 5); memset(Storage.Data, 0, (size_t)Storage.Size * sizeof(Storage.Data[0])); }